

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O3

bool __thiscall
RSTARPlanner::Search
          (RSTARPlanner *this,vector<int,_std::allocator<int>_> *pathIds,int *PathCost,
          bool bFirstSolution,bool bOptimalSolution,double MaxNumofSecs)

{
  double dVar1;
  pointer piVar2;
  RSTARSearchStateSpace_t *pRVar3;
  DiscreteSpaceInformation *pDVar4;
  pointer ppiVar5;
  void *pvVar6;
  long lVar7;
  pointer piVar8;
  int iVar9;
  clock_t cVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int CurrentPathCost;
  int local_84;
  double local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  pointer local_40;
  double local_38;
  
  local_80 = MaxNumofSecs;
  cVar10 = clock();
  this->TimeStarted = cVar10;
  this->highlevel_searchexpands = 0;
  this->lowlevel_searchexpands = 0;
  *PathCost = 1000000000;
  piVar2 = (pathIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((pathIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (pathIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  pRVar3 = this->pSearchStateSpace;
  pRVar3->eps = this->finitial_eps;
  pRVar3->eps_satisfied = 1000000000.0;
  if (pRVar3->bReinitializeSearchStateSpace == true) {
    ReInitializeSearchStateSpace(this);
  }
  if (bOptimalSolution) {
    this->pSearchStateSpace->eps = 1.0;
  }
  else {
    uVar12 = SUB84(local_80,0);
    uVar13 = (undefined4)((ulong)local_80 >> 0x20);
    if (!bFirstSolution) goto LAB_0013eeab;
  }
  uVar12 = 0;
  uVar13 = 0x41cdcd65;
LAB_0013eeab:
  pDVar4 = (this->super_SBPLPlanner).environment_;
  local_40 = (pDVar4->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppiVar5 = (pDVar4->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_80 = (double)CONCAT44(uVar13,uVar12);
  local_38 = (double)CONCAT44(uVar13,uVar12) * 1000000.0;
  do {
    dVar1 = this->pSearchStateSpace->eps_satisfied;
    if ((dVar1 < this->final_epsilon || dVar1 == this->final_epsilon) ||
       (cVar10 = clock(), local_38 <= (double)(cVar10 - this->TimeStarted))) break;
    clock();
    pRVar3 = this->pSearchStateSpace;
    if (ABS(pRVar3->eps_satisfied - pRVar3->eps) < 1e-07 && !bFirstSolution) {
      dVar1 = pRVar3->eps - this->dec_eps;
      pRVar3->eps = dVar1;
      if (dVar1 < this->final_epsilon) {
        pRVar3->eps = this->final_epsilon;
      }
      pRVar3->bReevaluatefvals = true;
      pRVar3->bReinitializeSearchStateSpace = true;
      pRVar3->bNewSearchIteration = true;
    }
    ReInitializeSearchStateSpace(this);
    pRVar3 = this->pSearchStateSpace;
    if (pRVar3->bNewSearchIteration == true) {
      pRVar3->searchiteration = pRVar3->searchiteration + 1;
      pRVar3->bNewSearchIteration = false;
    }
    if (pRVar3->bReevaluatefvals == true) {
      Reevaluatefvals(this);
    }
    iVar9 = ImprovePath(this,local_80);
    pRVar3 = this->pSearchStateSpace;
    if (iVar9 == 1) {
      pRVar3->eps_satisfied = pRVar3->eps;
    }
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pvVar6 = pRVar3->searchgoalstate->PlannerSpecificData;
    local_84 = *(int *)((long)pvVar6 + 0x20);
    iVar9 = 1000000000;
    if ((local_84 != 1000000000) &&
       (lVar7 = *(long *)(*(long *)((long)pvVar6 + 0x28) + 0x50),
       *(long *)(lVar7 + 0x10) != *(long *)(lVar7 + 8))) {
      GetSearchPath(&local_58,this,&local_84);
      piVar8 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      piVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar9 = local_84;
      if ((piVar2 != (pointer)0x0) &&
         (operator_delete(piVar2,(long)piVar8 - (long)piVar2), iVar9 = local_84,
         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start != (pointer)0x0)) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        iVar9 = local_84;
      }
    }
    if (iVar9 < *PathCost) {
      *PathCost = iVar9;
      std::vector<int,_std::allocator<int>_>::operator=(pathIds,&local_78);
    }
    if (bFirstSolution) {
      bVar11 = false;
    }
    else {
      bVar11 = *(int *)((long)this->pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x20)
               != 1000000000;
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  } while (bVar11);
  pDVar4 = (this->super_SBPLPlanner).environment_;
  this->MaxMemoryCounter =
       this->MaxMemoryCounter +
       ((int)((ulong)((long)ppiVar5 - (long)local_40) >> 3) -
       (int)((ulong)((long)(pDVar4->StateID2IndexMapping).
                           super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pDVar4->StateID2IndexMapping).
                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3)) * 4;
  return *PathCost != 1000000000;
}

Assistant:

bool RSTARPlanner::Search(vector<int>& pathIds, int & PathCost, bool bFirstSolution, bool bOptimalSolution,
                          double MaxNumofSecs)
{
    CKey key;
    TimeStarted = clock();
    highlevel_searchexpands = 0;
    lowlevel_searchexpands = 0;

    //reset the return values
    PathCost = INFINITECOST;
    pathIds.clear();

    //bFirstSolution = false; //TODO-remove this but then fix crashing because later
    //searches within cycle re-initialize g-vals and test path found fails if last search ran out of time
    //so we need to save solutions between iterations
    //also, we need to call change callnumber before each search

#if DEBUG
    SBPL_FPRINTF(fDeb, "new search call (call number=%d)\n", pSearchStateSpace->callnumber);
#endif

    //set epsilons
    pSearchStateSpace->eps = this->finitial_eps;
    pSearchStateSpace->eps_satisfied = INFINITECOST;

    if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
        //re-initialize state space
        ReInitializeSearchStateSpace();
    }

    if (bOptimalSolution) {
        pSearchStateSpace->eps = 1;
        MaxNumofSecs = INFINITECOST;
    }
    else if (bFirstSolution) {
        MaxNumofSecs = INFINITECOST;
    }

    //get the size of environment that is already allocated
    int oldenvsize = environment_->StateID2IndexMapping.size() * sizeof(int);

    //the main loop of R*
    int prevexpands = 0;
    clock_t loop_time;
    //TODO - change FINAL_EPS and DECREASE_EPS onto a parameter
    while (pSearchStateSpace->eps_satisfied > final_epsilon &&
           (clock() - TimeStarted) < MaxNumofSecs * (double)CLOCKS_PER_SEC)
    {
        loop_time = clock();

        //decrease eps for all subsequent iterations
        if (fabs(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < ERR_EPS && !bFirstSolution) {
            pSearchStateSpace->eps = pSearchStateSpace->eps - dec_eps;
            if (pSearchStateSpace->eps < final_epsilon) pSearchStateSpace->eps = final_epsilon;

            //the priorities need to be updated
            pSearchStateSpace->bReevaluatefvals = true;

            //it will be a new search. Since R* is non-incremental, it will have to be a new call
            pSearchStateSpace->bNewSearchIteration = true;
            pSearchStateSpace->bReinitializeSearchStateSpace = true;
        }

        //if(pSearchStateSpace->bReinitializeSearchStateSpace == true){
        //re-initialize state space
        ReInitializeSearchStateSpace(); //TODO - we have to do it currently since g-vals from old searches are invalid
        //}

        if (pSearchStateSpace->bNewSearchIteration) {
            pSearchStateSpace->searchiteration++;
            pSearchStateSpace->bNewSearchIteration = false;
        }

        //re-compute f-values if necessary and reorder the heap
        if (pSearchStateSpace->bReevaluatefvals) Reevaluatefvals();

        //improve or compute path
        if (ImprovePath(MaxNumofSecs) == 1) {
            pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps; //note: eps is satisfied probabilistically
        }

        //print the solution cost and eps bound
        SBPL_PRINTF("eps=%f highlevel expands=%d g(searchgoal)=%d time=%.3f\n", pSearchStateSpace->eps_satisfied,
                    highlevel_searchexpands - prevexpands,
                    ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g,
                    double(clock() - loop_time) / CLOCKS_PER_SEC);

#if DEBUG
        SBPL_FPRINTF(fDeb, "eps=%f highlevel expands=%d g(searchgoal)=%d time=%.3f\n",
                     pSearchStateSpace->eps_satisfied, highlevel_searchexpands - prevexpands,
                     ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g,
                     double(clock()-loop_time)/CLOCKS_PER_SEC);
        PrintSearchState((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData, fDeb);
#endif
        prevexpands = highlevel_searchexpands;

        //keep track of the best solution so far
        vector<int> CurrentPathIds;
        int CurrentPathCost = ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
        if (CurrentPathCost == INFINITECOST ||
            ((RSTARACTIONDATA*)((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->bestpredaction->PlannerSpecificData)->pathIDs.size() == 0)
        {
            //the path to the goal is not found, it is just goal has been
            //generated but the last edge to it wasn't computed yet
            CurrentPathCost = INFINITECOST;
        }
        else {
            //get the found path
            CurrentPathIds = GetSearchPath(CurrentPathCost);
        }
        //keep track of the best solution
        if (CurrentPathCost < PathCost) {
            PathCost = CurrentPathCost;
            pathIds = CurrentPathIds;
        }

        //if just the first solution then we are done
        if (bFirstSolution) break;

        //no solution exists
        if (((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g == INFINITECOST) break;
    }

#if DEBUG
    SBPL_FFLUSH(fDeb);
#endif

    MaxMemoryCounter += (oldenvsize - environment_->StateID2IndexMapping.size() * sizeof(int));
    SBPL_PRINTF("MaxMemoryCounter = %d\n", MaxMemoryCounter);

    bool ret = false;
    if (PathCost == INFINITECOST) {
        SBPL_PRINTF("could not find a solution\n");
        ret = false;
    }
    else {
        SBPL_PRINTF("solution is found\n");
        ret = true;
    }

    SBPL_PRINTF("total highlevel expands this call = %d, planning time = %.3f secs, solution cost=%d\n",
                highlevel_searchexpands, (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC), PathCost);

    //SBPL_FPRINTF(fStat, "%d %d\n", highlevel_searchexpands, MinPathCost);

    return ret;
}